

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_basic.hpp
# Opt level: O0

int lest::run<7ul>(test (*specification) [7],ostream *os)

{
  ostream *poVar1;
  allocator local_b9;
  string local_b8 [32];
  lest local_98 [72];
  message *e;
  test *local_40;
  test *testing;
  test *__end0;
  test *__begin0;
  test (*__range2) [7];
  ostream *poStack_18;
  int failures;
  ostream *os_local;
  test (*specification_local) [7];
  
  __range2._4_4_ = 0;
  testing = specification[1];
  __end0 = *specification;
  __begin0 = *specification;
  poStack_18 = os;
  os_local = (ostream *)specification;
  for (; __end0 != testing; __end0 = __end0 + 1) {
    local_40 = __end0;
    std::function<void_()>::operator()(&__end0->behaviour);
  }
  if (0 < __range2._4_4_) {
    poVar1 = (ostream *)std::ostream::operator<<(poStack_18,__range2._4_4_);
    poVar1 = std::operator<<(poVar1," out of ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,7);
    poVar1 = std::operator<<(poVar1," ");
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_b8,"test",&local_b9);
    pluralise(local_98,(text *)local_b8,7);
    poVar1 = std::operator<<(poVar1,(string *)local_98);
    poVar1 = std::operator<<(poVar1," failed.");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)local_98);
    std::__cxx11::string::~string(local_b8);
    std::allocator<char>::~allocator((allocator<char> *)&local_b9);
  }
  return __range2._4_4_;
}

Assistant:

int run( test const (&specification)[N], std::ostream & os = std::cout )
{
    int failures = 0;

    for ( auto & testing : specification )
    {
        try
        {
            testing.behaviour();
        }
        catch( message const & e )
        {
            ++failures;
            report( os, e, testing.name );
        }
    }

    if ( failures > 0 )
    {
        os << failures << " out of " << N << " " << pluralise("test", N) << " failed." << std::endl;
    }

    return failures;
}